

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void add_content_type(http_s *r)

{
  FIOBJ key;
  FIOBJ FVar1;
  FIOBJ obj;
  http_s *r_local;
  
  if (add_content_type::ct_hash == 0) {
    add_content_type::ct_hash = fiobj_hash_string("content-type",0xc);
  }
  FVar1 = fiobj_hash_get2((r->private_data).out_headers,add_content_type::ct_hash);
  key = HTTP_HEADER_CONTENT_TYPE;
  if (FVar1 == 0) {
    FVar1 = (r->private_data).out_headers;
    obj = http_mimetype_find2(r->path);
    fiobj_hash_set(FVar1,key,obj);
  }
  return;
}

Assistant:

static inline void add_content_type(http_s *r) {
  static uint64_t ct_hash = 0;
  if (!ct_hash)
    ct_hash = fiobj_hash_string("content-type", 12);
  if (!fiobj_hash_get2(r->private_data.out_headers, ct_hash)) {
    fiobj_hash_set(r->private_data.out_headers, HTTP_HEADER_CONTENT_TYPE,
                   http_mimetype_find2(r->path));
  }
}